

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

znzFile nifti_image_load_prep(nifti_image *nim)

{
  char **ppcVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong offset;
  znzFile fp;
  char fname [22];
  znzFile local_50;
  char local_48 [32];
  
  builtin_strncpy(local_48,"nifti_image_load_prep",0x16);
  if ((((nim == (nifti_image *)0x0) || (nim->iname == (char *)0x0)) ||
      (iVar2 = nim->nbyper, (long)iVar2 < 1)) || (sVar3 = nim->nvox, sVar3 == 0)) {
    if (g_opts_0 < 1) {
      return (znzFile)0x0;
    }
    if (nim == (nifti_image *)0x0) {
      nifti_image_load_prep_cold_2();
      return (znzFile)0x0;
    }
    fprintf(_stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",nim->iname,
            (ulong)(uint)nim->nbyper,(ulong)(uint)nim->nvox);
    return (znzFile)0x0;
  }
  ppcVar1 = &nim->iname;
  pcVar5 = nifti_findimgname(nim->iname,nim->nifti_type);
  if (pcVar5 == (char *)0x0) {
    if (g_opts_0 < 1) {
      return (znzFile)0x0;
    }
    nifti_image_load_prep_cold_1();
    return (znzFile)0x0;
  }
  iVar4 = nifti_is_gzfile(pcVar5);
  local_50 = znzopen(pcVar5,"rb",iVar4);
  if (local_50 == (znzFile)0x0) {
    if (0 < g_opts_0) {
      fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_48,"cannot open data file",pcVar5);
    }
    free(pcVar5);
    return (znzFile)0x0;
  }
  free(pcVar5);
  offset = (long)nim->iname_offset;
  if (-1 < (long)nim->iname_offset) {
LAB_00106759:
    lVar6 = znzseek(local_50,offset,0);
    if (lVar6 < 0) {
      fprintf(_stderr,"** could not seek to offset %u in file \'%s\'\n",offset & 0xffffffff,*ppcVar1
             );
      Xznzclose(&local_50);
      return (znzFile)0x0;
    }
    return local_50;
  }
  pcVar5 = *ppcVar1;
  iVar4 = nifti_is_gzfile(pcVar5);
  if (iVar4 == 0) {
    iVar4 = nifti_get_filesize(pcVar5);
    if (iVar4 != 0) {
      uVar8 = sVar3 * (long)iVar2;
      offset = 0;
      if (uVar8 <= (ulong)(long)iVar4) {
        offset = (long)iVar4 - uVar8;
      }
      goto LAB_00106759;
    }
    if (g_opts_0 < 1) goto LAB_00106811;
    pcVar5 = *ppcVar1;
    pcVar7 = "empty data file";
  }
  else {
    if (g_opts_0 < 1) goto LAB_00106811;
    pcVar7 = "negative offset for compressed file";
  }
  fprintf(_stderr,"** ERROR (%s): %s \'%s\'\n",local_48,pcVar7,pcVar5);
LAB_00106811:
  Xznzclose(&local_50);
  return (znzFile)0x0;
}

Assistant:

static znzFile nifti_image_load_prep( nifti_image *nim )
{
   /* set up data space, open data file and seek, then call nifti_read_buffer */
   size_t  ntot , ii , ioff;
   znzFile fp;
   char   *tmpimgname;
   char    fname[] = { "nifti_image_load_prep" };

   /**- perform sanity checks */
   if( nim == NULL      || nim->iname == NULL ||
       nim->nbyper <= 0 || nim->nvox <= 0       )
   {
      if ( g_opts.debug > 0 ){
         if( !nim ) fprintf(stderr,"** ERROR: N_image_load: no nifti image\n");
         else fprintf(stderr,"** ERROR: N_image_load: bad params (%p,%d,%u)\n",
                      nim->iname, nim->nbyper, (unsigned)nim->nvox);
      }
      return NULL;
   }

   ntot = nifti_get_volsize(nim) ; /* total bytes to read */

   /**- open image data file */

   tmpimgname = nifti_findimgname(nim->iname , nim->nifti_type);
   if( tmpimgname == NULL ){
      if( g_opts.debug > 0 )
         fprintf(stderr,"** no image file found for '%s'\n",nim->iname);
      return NULL;
   }

   fp = znzopen(tmpimgname, "rb", nifti_is_gzfile(tmpimgname));
   if (znz_isnull(fp)){
       if(g_opts.debug > 0) LNI_FERR(fname,"cannot open data file",tmpimgname);
       free(tmpimgname);
       return NULL;  /* bad open? */
   }
   free(tmpimgname);

   /**- get image offset: a negative offset means to figure from end of file */
   if( nim->iname_offset < 0 ){
     if( nifti_is_gzfile(nim->iname) ){
        if( g_opts.debug > 0 )
           LNI_FERR(fname,"negative offset for compressed file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ii = nifti_get_filesize( nim->iname ) ;
     if( ii <= 0 ){
        if( g_opts.debug > 0 ) LNI_FERR(fname,"empty data file",nim->iname);
        znzclose(fp);
        return NULL;
     }
     ioff = (ii > ntot) ? ii-ntot : 0 ;
   } else {                              /* non-negative offset   */
     ioff = nim->iname_offset ;          /* means use it directly */
   }

   /**- seek to the appropriate read position */
   if( znzseek(fp , (long)ioff , SEEK_SET) < 0 ){
      fprintf(stderr,"** could not seek to offset %u in file '%s'\n",
              (unsigned)ioff, nim->iname);
      znzclose(fp);
      return NULL;
   }

   /**- and return the File pointer */
   return fp;
}